

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listimagewindow.cc
# Opt level: O1

void __thiscall bgui::ListImageWindow::updateTitle(ListImageWindow *this)

{
  pointer pbVar1;
  int iVar2;
  ImageAdapterBase *pIVar3;
  ostream *poVar4;
  ostringstream os;
  char *local_1b0;
  long local_1a8;
  char local_1a0 [16];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  pIVar3 = ImageWindow::getAdapter(&this->super_ImageWindow);
  if (pIVar3 != (ImageAdapterBase *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    pbVar1 = (this->name).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,pbVar1[this->current]._M_dataplus._M_p,
                        pbVar1[this->current]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," - ",3);
    (*pIVar3->_vptr_ImageAdapterBase[5])(pIVar3);
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"x",1);
    (*pIVar3->_vptr_ImageAdapterBase[6])(pIVar3);
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"x",1);
    iVar2 = (*pIVar3->_vptr_ImageAdapterBase[7])(pIVar3);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    (*pIVar3->_vptr_ImageAdapterBase[8])(&local_1b0,pIVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_1b0,local_1a8);
    if (local_1b0 != local_1a0) {
      operator_delete(local_1b0);
    }
    if (this->kp != keep_none) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," -",2);
      if (this->kp == keep_most) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," ",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"keep",4);
      }
      if (this->kp == keep_all) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," ",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"keep_all",8);
      }
    }
    std::__cxx11::stringbuf::str();
    BaseWindow::setTitle((BaseWindow *)this,local_1b0);
    if (local_1b0 != local_1a0) {
      operator_delete(local_1b0);
    }
    BaseWindow::setInfoText((BaseWindow *)this,"");
    std::__cxx11::ostringstream::~ostringstream(local_190);
    std::ios_base::~ios_base(local_120);
    return;
  }
  ImageWindow::setAdapter
            (&this->super_ImageWindow,(ImageAdapterBase *)0x0,false,keep_none,-1,-1,false);
  BaseWindow::setTitle((BaseWindow *)this,"Image");
  BaseWindow::setInfoText((BaseWindow *)this,"No image!");
  return;
}

Assistant:

void ListImageWindow::updateTitle()
{
  ImageAdapterBase *adapt=getAdapter();

  // set image adapter and title

  if (adapt != 0)
  {
    std::ostringstream os;

    os << name[current] << " - " << adapt->getOriginalWidth() << "x" <<
       adapt->getOriginalHeight() << "x" << adapt->getOriginalDepth() <<
       " " << adapt->getOriginalType();

    if (kp != keep_none)
    {
      os << " -";

      if (kp == keep_most)
      {
        os << " " << "keep";
      }

      if (kp == keep_all)
      {
        os << " " << "keep_all";
      }
    }

    setTitle(os.str().c_str());
    setInfoText("");
  }
  else
  {
    setAdapter(0);
    setTitle("Image");
    setInfoText("No image!");
  }
}